

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_label.h
# Opt level: O0

result_type __thiscall
std::hash<label::JSONLabel>::operator()(hash<label::JSONLabel> *this,argument_type *s)

{
  uint __val;
  string *__lhs;
  size_t sVar1;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_21 [9];
  result_type h;
  argument_type *s_local;
  hash<label::JSONLabel> *this_local;
  
  h = (result_type)s;
  s_local = (argument_type *)this;
  __lhs = label::JSONLabel::to_string_abi_cxx11_(s);
  operator+(&local_68,__lhs,"hash");
  __val = label::JSONLabel::get_type((JSONLabel *)h);
  __cxx11::to_string(&local_88,__val);
  operator+(&local_48,&local_68,&local_88);
  sVar1 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(local_21,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  return sVar1;
}

Assistant:

result_type operator()(argument_type const& s) const noexcept {
        result_type const h ( std::hash<std::string>{}(s.to_string() + "hash" + 
            std::to_string(s.get_type())) );
        return h;
    }